

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O3

SUNErrCode
N_VScaleAddMultiVectorArray(int nvec,int nsum,sunrealtype *a,N_Vector *X,N_Vector **Y,N_Vector **Z)

{
  _func_SUNErrCode_int_int_sunrealtype_ptr_N_Vector_ptr_N_Vector_ptr_ptr_N_Vector_ptr_ptr
  *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  N_Vector *__ptr;
  N_Vector *__ptr_00;
  ulong uVar2;
  ulong uVar3;
  
  UNRECOVERED_JUMPTABLE = (*X)->ops->nvscaleaddmultivectorarray;
  if (UNRECOVERED_JUMPTABLE !=
      (_func_SUNErrCode_int_int_sunrealtype_ptr_N_Vector_ptr_N_Vector_ptr_ptr_N_Vector_ptr_ptr *)0x0
     ) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,nsum,a,X,Y,Z);
    return SVar1;
  }
  if ((*X)->ops->nvscaleaddmulti ==
      (_func_SUNErrCode_int_sunrealtype_ptr_N_Vector_N_Vector_ptr_N_Vector_ptr *)0x0) {
    if (0 < nvec) {
      uVar3 = 0;
      do {
        if (0 < nsum) {
          uVar2 = 0;
          do {
            (*(*X)->ops->nvlinearsum)(a[uVar2],X[uVar3],1.0,Y[uVar2][uVar3],Z[uVar2][uVar3]);
            uVar2 = uVar2 + 1;
          } while ((uint)nsum != uVar2);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != (uint)nvec);
    }
    SVar1 = 0;
  }
  else {
    __ptr = (N_Vector *)malloc((long)nsum << 3);
    __ptr_00 = (N_Vector *)malloc((long)nsum << 3);
    if (nvec < 1) {
      SVar1 = 0;
    }
    else {
      uVar3 = 0;
      do {
        if (0 < nsum) {
          uVar2 = 0;
          do {
            __ptr[uVar2] = Y[uVar2][uVar3];
            __ptr_00[uVar2] = Z[uVar2][uVar3];
            uVar2 = uVar2 + 1;
          } while ((uint)nsum != uVar2);
        }
        SVar1 = (*(*X)->ops->nvscaleaddmulti)(nsum,a,X[uVar3],__ptr,__ptr_00);
        if (SVar1 != 0) goto LAB_0010e662;
        uVar3 = uVar3 + 1;
      } while (uVar3 != (uint)nvec);
      SVar1 = 0;
    }
LAB_0010e662:
    free(__ptr);
    free(__ptr_00);
  }
  return SVar1;
}

Assistant:

SUNErrCode N_VScaleAddMultiVectorArray(int nvec, int nsum, sunrealtype* a,
                                       N_Vector* X, N_Vector** Y, N_Vector** Z)
{
  int i, j, ier;
  N_Vector* YY = NULL;
  N_Vector* ZZ = NULL;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(X[0]));

  if (X[0]->ops->nvscaleaddmultivectorarray != NULL)
  {
    ier = X[0]->ops->nvscaleaddmultivectorarray(nvec, nsum, a, X, Y, Z);
  }
  else if (X[0]->ops->nvscaleaddmulti != NULL)
  {
    /* allocate arrays of vectors */
    YY = (N_Vector*)malloc(nsum * sizeof(N_Vector));
    ZZ = (N_Vector*)malloc(nsum * sizeof(N_Vector));

    for (i = 0; i < nvec; i++)
    {
      for (j = 0; j < nsum; j++)
      {
        YY[j] = Y[j][i];
        ZZ[j] = Z[j][i];
      }

      ier = X[0]->ops->nvscaleaddmulti(nsum, a, X[i], YY, ZZ);
      if (ier != 0) { break; }
    }

    /* free array of vectors */
    free(YY);
    free(ZZ);
  }
  else
  {
    for (i = 0; i < nvec; i++)
    {
      for (j = 0; j < nsum; j++)
      {
        X[0]->ops->nvlinearsum(a[j], X[i], SUN_RCONST(1.0), Y[j][i], Z[j][i]);
      }
    }
    ier = SUN_SUCCESS;
  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(X[0]));
  return (ier);
}